

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O0

void __thiscall hwtest::pgraph::anon_unknown_17::MthdSyfmSrcPos::emulate_mthd(MthdSyfmSrcPos *this)

{
  int cstat;
  int ycstat;
  MthdSyfmSrcPos *this_local;
  
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.misc32[1] =
       (this->super_SingleMthdTest).super_MthdTest.val;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[2][1] =
       (this->super_SingleMthdTest).super_MthdTest.val & 0xffff0000;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] & 0xffffefff |
       0x1000;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] & 0xfffffeff;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[0][1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[4][1];
  cstat = nv03_pgraph_clip_status
                    (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                     (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[0][1],1,
                     false);
  pgraph_set_xy_d(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,1,1,1,false,false
                  ,false,cstat);
  pgraph_prep_draw(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,false,false);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_3 =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_3 & 0xfffffffe;
  pgraph_set_xy_d(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,1,1,1,false,
                  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[0][1] !=
                  (int)(short)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy
                              [0][1],false,cstat);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_a =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_a & 0xfffc0000 |
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[1][1] & 0x3ffff;
  return;
}

Assistant:

void emulate_mthd() override {
		exp.misc32[1] = val;
		exp.vtx_xy[2][1] = val & 0xffff0000;
		insrt(exp.valid[0], 12, 1, 1);
		insrt(exp.valid[0], 8, 1, 0);
		exp.vtx_xy[0][1] = exp.vtx_xy[4][1];
		int ycstat = nv03_pgraph_clip_status(&exp, exp.vtx_xy[0][1], 1, false);
		pgraph_set_xy_d(&exp, 1, 1, 1, false, false, false, ycstat);
		pgraph_prep_draw(&exp, false, false);
		insrt(exp.xy_misc_3, 0, 1, 0);
		pgraph_set_xy_d(&exp, 1, 1, 1, false, (int32_t)exp.vtx_xy[0][1] != (int16_t)exp.vtx_xy[0][1], false, ycstat);
		insrt(exp.xy_a, 0, 18, exp.vtx_xy[1][1]);
	}